

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::UnitTest::PushGTestTrace(UnitTest *this,TraceInfo *trace)

{
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *this_00;
  MutexLock lock;
  GTestMutexLock local_18;
  
  local_18.mutex_ = &(this->mutex_).super_MutexBase;
  internal::MutexBase::Lock(local_18.mutex_);
  this_00 = internal::
            ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
            ::GetOrCreateValue(&this->impl_->gtest_trace_stack_);
  std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::
  push_back(this_00,trace);
  internal::GTestMutexLock::~GTestMutexLock(&local_18);
  return;
}

Assistant:

void UnitTest::PushGTestTrace(const internal::TraceInfo& trace) {
  internal::MutexLock lock(&mutex_);
  impl_->gtest_trace_stack().push_back(trace);
}